

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::EnumColumnWriter::WriteEnumInternal<unsigned_short>
          (EnumColumnWriter *this,WriteStream *temp_writer,Vector *input_column,idx_t chunk_start,
          idx_t chunk_end,EnumWriterPageState *page_state)

{
  unsigned_long *puVar1;
  idx_t r;
  undefined1 local_45;
  uint local_44;
  EnumColumnWriter *local_40;
  data_ptr_t local_38;
  
  local_40 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (chunk_start < chunk_end) {
    local_38 = input_column->data;
    do {
      puVar1 = (input_column->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) ||
         ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
        if (page_state->written_value == false) {
          local_45 = (undefined1)local_40->bit_width;
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_45,1);
          (page_state->encoder).rle_count = 0;
          (page_state->encoder).bp_block_count = 0;
          page_state->written_value = true;
        }
        local_44 = (uint)*(ushort *)(local_38 + chunk_start * 2);
        RleBpEncoder::WriteValue(&page_state->encoder,temp_writer,&local_44);
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
  }
  return;
}

Assistant:

void EnumColumnWriter::WriteEnumInternal(WriteStream &temp_writer, Vector &input_column, idx_t chunk_start,
                                         idx_t chunk_end, EnumWriterPageState &page_state) {
	auto &mask = FlatVector::Validity(input_column);
	auto *ptr = FlatVector::GetData<T>(input_column);
	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (mask.RowIsValid(r)) {
			if (!page_state.written_value) {
				// first value: write the bit-width as a one-byte entry and initialize writer
				temp_writer.Write<uint8_t>(bit_width);
				page_state.encoder.BeginWrite();
				page_state.written_value = true;
			}
			page_state.encoder.WriteValue(temp_writer, ptr[r]);
		}
	}
}